

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.h
# Opt level: O0

void __thiscall
cxxopts::OptionValue::parse
          (OptionValue *this,shared_ptr<const_cxxopts::OptionDetails> *details,string *text)

{
  element_type *peVar1;
  element_type *this_00;
  OptionNames *pOVar2;
  string *text_local;
  shared_ptr<const_cxxopts::OptionDetails> *details_local;
  OptionValue *this_local;
  
  ensure_value(this,details);
  this->m_count = this->m_count + 1;
  peVar1 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_value);
  (*peVar1->_vptr_Value[3])(peVar1,text);
  this_00 = std::
            __shared_ptr_access<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)details);
  pOVar2 = OptionDetails::long_names_abi_cxx11_(this_00);
  this->m_long_names = pOVar2;
  return;
}

Assistant:

void
  parse
  (
    const std::shared_ptr<const OptionDetails>& details,
    const std::string& text
  )
  {
    ensure_value(details);
    ++m_count;
    m_value->parse(text);
    m_long_names = &details->long_names();
  }